

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ProgramSeparableCase::iterate(ProgramSeparableCase *this)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  GLenum GVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TestLog *pTVar9;
  Context *pCVar10;
  TestError *pTVar11;
  char *in_RCX;
  GLint local_4a4;
  undefined1 local_4a0 [4];
  int linkStatus_1;
  Program program_2;
  string local_458;
  allocator<char> local_431;
  string local_430;
  ScopedLogSection local_410;
  ScopedLogSection section_4;
  undefined1 local_400 [4];
  int linkStatus;
  Program program_1;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  ScopedLogSection local_370;
  ScopedLogSection section_3;
  Program program;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  ScopedLogSection local_2d8;
  ScopedLogSection section_2;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  ScopedLogSection local_280;
  ScopedLogSection section_1;
  string local_270;
  allocator<char> local_249;
  string local_248;
  ScopedLogSection local_228;
  ScopedLogSection section;
  char *fragSourcePtr;
  char *vtxSourcePtr;
  string fStr;
  string vStr;
  Shader frgShader;
  Shader vtxShader;
  string local_f8;
  undefined1 local_d8 [8];
  ResultCollector result;
  CallLogWrapper gl;
  string local_68 [8];
  string fragTemplate;
  allocator<char> local_31;
  string local_30 [8];
  string vtxTemplate;
  ProgramSeparableCase *this_local;
  
  vtxTemplate.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "${GLSL_VERSION_DECL}\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "${GLSL_VERSION_DECL}\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,(allocator<char> *)&gl.field_0x17);
  std::allocator<char>::~allocator((allocator<char> *)&gl.field_0x17);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar8->_vptr_RenderContext[3])();
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar9);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8," // ERROR: ",
             (allocator<char> *)((long)&vtxShader.m_info.compileTimeUs + 7));
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_d8,pTVar9,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&vtxShader.m_info.compileTimeUs + 7));
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::Shader::Shader((Shader *)&frgShader.m_info.compileTimeUs,pRVar8,SHADERTYPE_VERTEX);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::Shader::Shader((Shader *)((long)&vStr.field_2 + 8),pRVar8,SHADERTYPE_FRAGMENT);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar10 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)((long)&fStr.field_2 + 8),(_anonymous_namespace_ *)pCVar1,pCVar10,in_RCX);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar10 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&vtxSourcePtr,(_anonymous_namespace_ *)pCVar1,pCVar10,in_RCX);
  fragSourcePtr = (char *)std::__cxx11::string::c_str();
  section.m_log = (TestLog *)std::__cxx11::string::c_str();
  glu::Shader::setSources((Shader *)&frgShader.m_info.compileTimeUs,1,&fragSourcePtr,(int *)0x0);
  glu::Shader::setSources((Shader *)((long)&vStr.field_2 + 8),1,(char **)&section,(int *)0x0);
  glu::Shader::compile((Shader *)&frgShader.m_info.compileTimeUs);
  glu::Shader::compile((Shader *)((long)&vStr.field_2 + 8));
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"VtxShader",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Vertex shader",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_228,pTVar9,&local_248,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,(Shader *)&frgShader.m_info.compileTimeUs);
  tcu::ScopedLogSection::~ScopedLogSection(&local_228);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"FrgShader",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"Fragment shader",(allocator<char> *)((long)&section_2.m_log + 7))
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_280,pTVar9,&local_2a0,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,(Shader *)((long)&vStr.field_2 + 8));
  tcu::ScopedLogSection::~ScopedLogSection(&local_280);
  while (((dVar4 = ::deGetFalse(), dVar4 == 0 &&
          (bVar2 = glu::Shader::getCompileStatus((Shader *)&frgShader.m_info.compileTimeUs), bVar2))
         && (bVar2 = glu::Shader::getCompileStatus((Shader *)((long)&vStr.field_2 + 8)), bVar2))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      glu::CallLogWrapper::enableLogging
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"Initial",&local_2f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,"Initial",
                 (allocator<char> *)((long)&program.m_info.linkTimeUs + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_2d8,pTVar9,&local_2f8,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator((allocator<char> *)((long)&program.m_info.linkTimeUs + 7));
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
      glu::Program::Program((Program *)&section_3,pRVar8);
      dVar5 = glu::Program::getProgram((Program *)&section_3);
      gls::StateQueryUtil::verifyStateProgramInteger
                ((ResultCollector *)local_d8,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,dVar5,0x8258,0,this->m_verifier);
      glu::Program::~Program((Program *)&section_3);
      tcu::ScopedLogSection::~ScopedLogSection(&local_2d8);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"SetFalse",&local_391)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"SetFalse",
                 (allocator<char> *)((long)&program_1.m_info.linkTimeUs + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_370,pTVar9,&local_390,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&program_1.m_info.linkTimeUs + 7));
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator(&local_391);
      pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
      glu::Program::Program((Program *)local_400,pRVar8);
      section_4.m_log._4_4_ = 0;
      dVar5 = glu::Program::getProgram((Program *)local_400);
      dVar6 = glu::Shader::getShader((Shader *)&frgShader.m_info.compileTimeUs);
      glu::CallLogWrapper::glAttachShader
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,dVar6);
      dVar5 = glu::Program::getProgram((Program *)local_400);
      dVar6 = glu::Shader::getShader((Shader *)((long)&vStr.field_2 + 8));
      glu::CallLogWrapper::glAttachShader
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,dVar6);
      dVar5 = glu::Program::getProgram((Program *)local_400);
      glu::CallLogWrapper::glProgramParameteri
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,0x8258,0);
      dVar5 = glu::Program::getProgram((Program *)local_400);
      glu::CallLogWrapper::glLinkProgram
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5);
      GVar7 = glu::CallLogWrapper::glGetError
                        ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      glu::checkError(GVar7,"setup program",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                      ,0x19a);
      dVar5 = glu::Program::getProgram((Program *)local_400);
      glu::CallLogWrapper::glGetProgramiv
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,0x8b82,
                 (GLint *)((long)&section_4.m_log + 4));
      GVar7 = glu::CallLogWrapper::glGetError
                        ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      glu::checkError(GVar7,"query link status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                      ,0x19d);
      while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (section_4.m_log._4_4_ == 1))) {
        dVar4 = ::deGetFalse();
        if (dVar4 == 0) {
          dVar5 = glu::Program::getProgram((Program *)local_400);
          gls::StateQueryUtil::verifyStateProgramInteger
                    ((ResultCollector *)local_d8,
                     (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,0x8258,0,
                     this->m_verifier);
          glu::Program::~Program((Program *)local_400);
          tcu::ScopedLogSection::~ScopedLogSection(&local_370);
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_430,"SetTrue",&local_431);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_458,"SetTrue",
                     (allocator<char> *)((long)&program_2.m_info.linkTimeUs + 7));
          tcu::ScopedLogSection::ScopedLogSection(&local_410,pTVar9,&local_430,&local_458);
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&program_2.m_info.linkTimeUs + 7));
          std::__cxx11::string::~string((string *)&local_430);
          std::allocator<char>::~allocator(&local_431);
          pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
          glu::Program::Program((Program *)local_4a0,pRVar8);
          local_4a4 = 0;
          dVar5 = glu::Program::getProgram((Program *)local_4a0);
          dVar6 = glu::Shader::getShader((Shader *)&frgShader.m_info.compileTimeUs);
          glu::CallLogWrapper::glAttachShader
                    ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,dVar6);
          dVar5 = glu::Program::getProgram((Program *)local_4a0);
          dVar6 = glu::Shader::getShader((Shader *)((long)&vStr.field_2 + 8));
          glu::CallLogWrapper::glAttachShader
                    ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,dVar6);
          dVar5 = glu::Program::getProgram((Program *)local_4a0);
          glu::CallLogWrapper::glProgramParameteri
                    ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,0x8258,1);
          dVar5 = glu::Program::getProgram((Program *)local_4a0);
          glu::CallLogWrapper::glLinkProgram
                    ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5);
          GVar7 = glu::CallLogWrapper::glGetError
                            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
          glu::checkError(GVar7,"setup program",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                          ,0x1ad);
          dVar5 = glu::Program::getProgram((Program *)local_4a0);
          glu::CallLogWrapper::glGetProgramiv
                    ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,0x8b82,&local_4a4
                    );
          GVar7 = glu::CallLogWrapper::glGetError
                            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
          glu::checkError(GVar7,"query link status",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                          ,0x1b0);
          while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (local_4a4 == 1))) {
            dVar4 = ::deGetFalse();
            if (dVar4 == 0) {
              dVar5 = glu::Program::getProgram((Program *)local_4a0);
              gls::StateQueryUtil::verifyStateProgramInteger
                        ((ResultCollector *)local_d8,
                         (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar5,0x8258,1,
                         this->m_verifier);
              glu::Program::~Program((Program *)local_4a0);
              tcu::ScopedLogSection::~ScopedLogSection(&local_410);
              tcu::ResultCollector::setTestContextResult
                        ((ResultCollector *)local_d8,
                         (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              std::__cxx11::string::~string((string *)&vtxSourcePtr);
              std::__cxx11::string::~string((string *)(fStr.field_2._M_local_buf + 8));
              glu::Shader::~Shader((Shader *)((long)&vStr.field_2 + 8));
              glu::Shader::~Shader((Shader *)&frgShader.m_info.compileTimeUs);
              tcu::ResultCollector::~ResultCollector((ResultCollector *)local_d8);
              glu::CallLogWrapper::~CallLogWrapper
                        ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
              std::__cxx11::string::~string(local_68);
              std::__cxx11::string::~string(local_30);
              return STOP;
            }
          }
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,"failed to link program","linkStatus == GL_TRUE",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                     ,0x1b2);
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,"failed to link program","linkStatus == GL_TRUE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                 ,0x19f);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,"failed to build shaders",
             "vtxShader.getCompileStatus() && frgShader.getCompileStatus()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x186);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ProgramSeparableCase::IterateResult ProgramSeparableCase::iterate (void)
{
	const string				vtxTemplate	=	"${GLSL_VERSION_DECL}\n"
												"out highp vec4 v_color;\n"
												"void main()\n"
												"{\n"
												"	gl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n"
												"	v_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n"
												"}\n";
	const string				fragTemplate =	"${GLSL_VERSION_DECL}\n"
												"in highp vec4 v_color;\n"
												"layout(location=0) out highp vec4 o_color;\n"
												"void main()\n"
												"{\n"
												"	o_color = v_color;\n"
												"}\n";

	glu::CallLogWrapper			gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result			(m_testCtx.getLog(), " // ERROR: ");
	glu::Shader					vtxShader		(m_context.getRenderContext(), glu::SHADERTYPE_VERTEX);
	glu::Shader					frgShader		(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);

	const std::string			vStr			= specializeShader(m_context, vtxTemplate.c_str());
	const std::string			fStr			= specializeShader(m_context, fragTemplate.c_str());
	const char* const			vtxSourcePtr	= vStr.c_str();
	const char* const			fragSourcePtr	= fStr.c_str();

	vtxShader.setSources(1, &vtxSourcePtr, DE_NULL);
	frgShader.setSources(1, &fragSourcePtr, DE_NULL);

	vtxShader.compile();
	frgShader.compile();

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxShader", "Vertex shader");
		m_testCtx.getLog() << vtxShader;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgShader", "Fragment shader");
		m_testCtx.getLog() << frgShader;
	}

	TCU_CHECK_MSG(vtxShader.getCompileStatus() && frgShader.getCompileStatus(), "failed to build shaders");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), "Initial", "Initial");
		glu::Program				program	(m_context.getRenderContext());

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "SetFalse", "SetFalse");
		glu::Program				program		(m_context.getRenderContext());
		int							linkStatus	= 0;

		gl.glAttachShader(program.getProgram(), vtxShader.getShader());
		gl.glAttachShader(program.getProgram(), frgShader.getShader());
		gl.glProgramParameteri(program.getProgram(), GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.glLinkProgram(program.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup program");

		gl.glGetProgramiv(program.getProgram(), GL_LINK_STATUS, &linkStatus);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query link status");

		TCU_CHECK_MSG(linkStatus == GL_TRUE, "failed to link program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "SetTrue", "SetTrue");
		glu::Program				program		(m_context.getRenderContext());
		int							linkStatus	= 0;

		gl.glAttachShader(program.getProgram(), vtxShader.getShader());
		gl.glAttachShader(program.getProgram(), frgShader.getShader());
		gl.glProgramParameteri(program.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.glLinkProgram(program.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup program");

		gl.glGetProgramiv(program.getProgram(), GL_LINK_STATUS, &linkStatus);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query link status");

		TCU_CHECK_MSG(linkStatus == GL_TRUE, "failed to link program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}